

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O1

string * __thiscall
BayesianGameBase::SoftPrintType_abi_cxx11_
          (string *__return_storage_ptr__,BayesianGameBase *this,Index agentI,Index typeIndex)

{
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"BGType",6);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string BayesianGameBase::SoftPrintType(Index agentI, Index typeIndex) const
{
    stringstream ss;
    ss << "BGType"<<typeIndex;
    return(ss.str());
}